

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cxxopts::OptionValue::as<std::__cxx11::string>(OptionValue *this)

{
  bool bVar1;
  string *psVar2;
  element_type *peVar3;
  abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool local_32;
  allocator<char> local_31;
  string local_30;
  OptionValue *local_10;
  OptionValue *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->m_value,(nullptr_t)0x0);
  if (bVar1) {
    local_32 = this->m_long_names != (OptionNames *)0x0;
    if (local_32) {
      psVar2 = first_or_empty(this->m_long_names);
      std::__cxx11::string::string((string *)&local_30,(string *)psVar2);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
    }
    local_32 = !local_32;
    throw_or_mimic<cxxopts::exceptions::option_has_no_value>(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (local_32) {
      std::allocator<char>::~allocator(&local_31);
    }
  }
  peVar3 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->m_value);
  this_00 = (abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)__dynamic_cast(peVar3,&Value::typeinfo,
                              &values::standard_value<std::__cxx11::string>::typeinfo,0);
  if (this_00 !=
      (abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    pbVar4 = values::
             abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(this_00);
    return pbVar4;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
  as() const
  {
    if (m_value == nullptr) {
        throw_or_mimic<exceptions::option_has_no_value>(
            m_long_names == nullptr ? "" : first_or_empty(*m_long_names));
    }

    return CXXOPTS_RTTI_CAST<const values::standard_value<T>&>(*m_value).get();
  }